

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_strto(jit_State *J)

{
  int iVar1;
  TValue n;
  TValue tv;
  TValue *in_stack_ffffffffffffffc8;
  jit_State *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  
  iVar1 = lj_strscan_num((GCstr *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    local_1c = 3;
  }
  else {
    local_1c = lj_ir_knum_u64(in_stack_ffffffffffffffd0,(uint64_t)in_stack_ffffffffffffffc8);
  }
  return local_1c;
}

Assistant:

LJFOLD(STRTO KGC)
LJFOLDF(kfold_strto)
{
  TValue n;
  if (lj_strscan_num(ir_kstr(fleft), &n))
    return lj_ir_knum(J, numV(&n));
  return FAILFOLD;
}